

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

uint8_t hex4_to_digest(char data)

{
  char local_b;
  uint8_t local_9;
  char base;
  char data_local;
  
  local_b = '0';
  if ('9' < data) {
    if (data < 'G') {
      local_b = '7';
    }
    else {
      if ('f' < data) {
        return '\0';
      }
      local_b = 'W';
    }
  }
  if (data < local_b) {
    local_9 = '\0';
  }
  else {
    local_9 = data - local_b;
  }
  return local_9;
}

Assistant:

static uint8_t hex4_to_digest(char data)
{
	char base = '0';

	if (data > '9') {
		if (data > 'F') {
			if (data > 'f')
				return 0;
			base = 'a' - 10;
		} else {
			base = 'A' - 10;
		}
	}

	if (data < base)
		return 0;

	return data - base;
}